

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<wchar_t>::write_int<int,fmt::FormatSpec>
          (BasicWriter<wchar_t> *this,int value,FormatSpec spec)

{
  undefined4 uVar1;
  int iVar2;
  lconv *plVar3;
  size_t sVar4;
  CharPtr pwVar5;
  CharPtr pwVar6;
  byte bVar7;
  uint uVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  wchar_t wVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  char in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar17;
  
  uVar1 = spec._20_4_;
  uVar14 = (ulong)(uint)value;
  uVar17 = 0;
  if (value < 0) {
    uVar17 = 0x2d;
    uVar14 = (ulong)(uint)-value;
LAB_0025499d:
    uVar13 = 1;
  }
  else {
    uVar13 = 0;
    if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      bVar7 = 0x2b;
      if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
        bVar7 = 0x20;
      }
      uVar17 = (uint)bVar7;
      goto LAB_0025499d;
    }
  }
  uVar8 = (uint)uVar14;
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_00254cb2;
      if (spec.type_ == 'B') {
LAB_00254bd6:
        uVar17 = uVar13;
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          (&stack0xffffffffffffffc4)[uVar13] = 0x30;
          uVar17 = uVar13 | 2;
          (&stack0xffffffffffffffc5)[uVar13] = spec.type_;
        }
        uVar13 = 0;
        uVar15 = uVar14;
        do {
          uVar13 = uVar13 + 1;
          uVar8 = (uint)uVar15;
          uVar15 = uVar15 >> 1;
        } while (1 < uVar8);
        pwVar6 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar13,&spec,&stack0xffffffffffffffc4,uVar17);
        do {
          uVar17 = (uint)uVar14;
          *pwVar6 = uVar17 & 1 | 0x30;
          pwVar6 = pwVar6 + -1;
          uVar14 = uVar14 >> 1;
        } while (1 < uVar17);
        return;
      }
    }
    else {
      if (spec.type_ == 'X') goto LAB_00254c40;
      if (spec.type_ == 'b') goto LAB_00254bd6;
    }
code_r0x00254e0d:
    internal::report_unknown_type
              (in_stack_ffffffffffffffbf,(char *)CONCAT44(uVar17,in_stack_ffffffffffffffc0));
  }
  if (0x6e < (byte)spec.type_) {
    if (spec.type_ == 'o') {
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        uVar15 = (ulong)uVar13;
        uVar13 = uVar13 + 1;
        (&stack0xffffffffffffffc4)[uVar15] = 0x30;
      }
      uVar17 = 0;
      uVar15 = uVar14;
      do {
        uVar17 = uVar17 + 1;
        uVar8 = (uint)uVar15;
        uVar15 = uVar15 >> 3;
      } while (7 < uVar8);
      pwVar6 = prepare_int_buffer<fmt::FormatSpec>
                         (this,uVar17,&spec,&stack0xffffffffffffffc4,uVar13);
      do {
        uVar17 = (uint)uVar14;
        *pwVar6 = uVar17 & 7 | 0x30;
        pwVar6 = pwVar6 + -1;
        uVar14 = uVar14 >> 3;
      } while (7 < uVar17);
      return;
    }
    if (spec.type_ == 'x') {
LAB_00254c40:
      uVar17 = uVar13;
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        (&stack0xffffffffffffffc4)[uVar13] = 0x30;
        uVar17 = uVar13 | 2;
        (&stack0xffffffffffffffc5)[uVar13] = spec.type_;
      }
      uVar13 = 0;
      uVar15 = uVar14;
      do {
        uVar13 = uVar13 + 1;
        uVar8 = (uint)uVar15;
        uVar15 = uVar15 >> 4;
      } while (0xf < uVar8);
      pwVar6 = prepare_int_buffer<fmt::FormatSpec>
                         (this,uVar13,&spec,&stack0xffffffffffffffc4,uVar17);
      pcVar9 = "0123456789ABCDEF";
      if (spec.type_ == 'x') {
        pcVar9 = "0123456789abcdef";
      }
      do {
        uVar17 = (uint)uVar14;
        *pwVar6 = (int)pcVar9[uVar17 & 0xf];
        pwVar6 = pwVar6 + -1;
        uVar14 = uVar14 >> 4;
      } while (0xf < uVar17);
      return;
    }
    goto code_r0x00254e0d;
  }
  if (spec.type_ == 'd') {
LAB_00254cb2:
    uVar17 = 0x1f;
    if ((uVar8 | 1) != 0) {
      for (; (uVar8 | 1) >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    uVar17 = (uVar17 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    pwVar6 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar17 - (uVar8 < internal::BasicData<void>::POWERS_OF_10_32[uVar17]))
                             + 1,&spec,&stack0xffffffffffffffc4,uVar13);
    pwVar6 = pwVar6 + 1;
    if (99 < uVar8) {
      do {
        uVar17 = (uint)uVar14;
        uVar8 = (uint)(uVar14 / 100);
        uVar14 = uVar14 / 100;
        uVar15 = (ulong)(uVar17 + (int)uVar14 * -100);
        pwVar6[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar15 * 2 + 1];
        pwVar6[-2] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar15 * 2];
        pwVar6 = pwVar6 + -2;
      } while (9999 < uVar17);
    }
    if (uVar8 < 10) {
      uVar8 = uVar8 | 0x30;
      lVar10 = -4;
    }
    else {
      pwVar6[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [((ulong)uVar8 * 2 & 0xffffffff) + 1];
      uVar8 = (uint)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                    [(ulong)uVar8 * 2];
      lVar10 = -8;
    }
    *(uint *)((long)pwVar6 + lVar10) = uVar8;
    return;
  }
  if (spec.type_ != 'n') goto code_r0x00254e0d;
  uVar17 = 0x1f;
  if ((uVar8 | 1) != 0) {
    for (; (uVar8 | 1) >> uVar17 == 0; uVar17 = uVar17 - 1) {
    }
  }
  uVar17 = (uVar17 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  plVar3 = localeconv();
  pcVar9 = plVar3->thousands_sep;
  sVar4 = strlen(pcVar9);
  uVar17 = uVar17 - (uVar8 < internal::BasicData<void>::POWERS_OF_10_32[uVar17]);
  pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                     (this,uVar17 + (int)sVar4 * (uVar17 / 3) + 1,&spec,&stack0xffffffffffffffc4,
                      uVar13);
  pwVar6 = pwVar5 + 1;
  if (uVar8 < 100) {
    if (9 < uVar8) {
      uVar14 = (ulong)(uVar8 * 2);
      *pwVar5 = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                     [uVar14 + 1];
      goto LAB_00254dd7;
    }
  }
  else {
    iVar2 = 0;
    do {
      uVar15 = uVar14;
      uVar17 = (uint)uVar15;
      uVar8 = (uint)(uVar15 / 100);
      iVar11 = (int)(uVar15 / 100);
      uVar14 = (ulong)((uVar17 + iVar11 * -100) * 2);
      pwVar6[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [uVar14 + 1];
      pwVar6 = pwVar6 + -1;
      if (iVar2 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        pwVar6 = pwVar6 + -sVar4;
        if (0 < (long)sVar4) {
          lVar10 = 0;
          uVar16 = sVar4 + 1;
          do {
            pwVar6[lVar10] = (int)pcVar9[lVar10];
            uVar16 = uVar16 - 1;
            lVar10 = lVar10 + 1;
          } while (1 < uVar16);
          goto LAB_00254ae4;
        }
        pwVar6[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar14];
        lVar10 = 0;
        if ((uint)((iVar2 + 2) * -0x55555555) < 0x55555556) {
          lVar10 = -sVar4;
        }
        pwVar6 = pwVar6 + lVar10 + -1;
      }
      else {
LAB_00254ae4:
        pwVar6[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar14];
        pwVar6 = pwVar6 + -1;
        if (((uint)((iVar2 + 2) * -0x55555555) < 0x55555556) &&
           (pwVar6 = pwVar6 + -sVar4, 0 < (long)sVar4)) {
          lVar10 = 0;
          uVar14 = sVar4 + 1;
          do {
            pwVar6[lVar10] = (int)pcVar9[lVar10];
            uVar14 = uVar14 - 1;
            lVar10 = lVar10 + 1;
          } while (1 < uVar14);
        }
      }
      iVar2 = iVar2 + 2;
      uVar14 = uVar15 / 100;
    } while (9999 < uVar17);
    if (999 < uVar17) {
      uVar14 = (ulong)(uint)(iVar11 + (int)(uVar15 / 100));
      pwVar5 = pwVar6 + -1;
      pwVar6[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [uVar14 + 1];
      if ((iVar2 * -0x55555555 + 0xaaaaaaabU < 0x55555556) &&
         (pwVar5 = pwVar5 + -sVar4, 0 < (long)sVar4)) {
        uVar15 = sVar4 + 1;
        lVar10 = 0;
        do {
          pwVar5[lVar10] = (int)pcVar9[lVar10];
          uVar15 = uVar15 - 1;
          lVar10 = lVar10 + 1;
        } while (1 < uVar15);
      }
LAB_00254dd7:
      wVar12 = (wchar_t)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [uVar14];
      goto LAB_00254de4;
    }
  }
  pwVar5 = pwVar6;
  wVar12 = uVar8 | 0x30;
LAB_00254de4:
  pwVar5[-1] = wVar12;
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}